

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::MILSpec::Dimension_UnknownDimension::ByteSizeLong
          (Dimension_UnknownDimension *this)

{
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = (size_t)((uint)this->variadic_ * 2);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

inline bool Dimension_UnknownDimension::_internal_variadic() const {
  return variadic_;
}